

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O1

void __thiscall
QRhiResourceUpdateBatch::uploadStaticBuffer
          (QRhiResourceUpdateBatch *this,QRhiBuffer *buf,void *data)

{
  quint32 size;
  int iVar1;
  QRhiResourceUpdateBatchPrivate *pQVar2;
  void *pvVar3;
  long lVar4;
  long in_FS_OFFSET;
  BufferOp op;
  BufferOp local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  size = buf->m_size;
  if (size != 0) {
    pQVar2 = this->d;
    iVar1 = pQVar2->activeBufferOpCount;
    pQVar2->activeBufferOpCount = iVar1 + 1;
    if ((long)iVar1 <
        (pQVar2->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
        super_QVLABaseBase.s) {
      pvVar3 = (pQVar2->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
               super_QVLABaseBase.ptr;
      lVar4 = (long)iVar1 * 0x30;
      *(undefined4 *)((long)pvVar3 + lVar4) = 1;
      *(QRhiBuffer **)((long)pvVar3 + lVar4 + 8) = buf;
      *(undefined4 *)((long)pvVar3 + lVar4 + 0x10) = 0;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QRhiBufferData::assign((QRhiBufferData *)((long)pvVar3 + lVar4 + 0x18),(char *)data,size);
        return;
      }
      goto LAB_00456cc0;
    }
    local_58.data.d = (QRhiBufferDataPrivate *)0x0;
    local_58.readSize = 0;
    local_58._36_4_ = 0;
    local_58.result = (QRhiReadbackResult *)0x0;
    local_58.type = StaticUpload;
    local_58._4_4_ = 0;
    local_58.offset = 0;
    local_58._20_4_ = 0;
    local_58.buf = buf;
    QRhiBufferData::assign(&local_58.data,(char *)data,size);
    QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>::
    emplace_back_impl<QRhiResourceUpdateBatchPrivate::BufferOp>
              (&(pQVar2->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>,0x40,
               &(pQVar2->bufferOps).super_QVLAStorage<48UL,_8UL,_64LL>,&local_58);
    QRhiBufferData::~QRhiBufferData(&local_58.data);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_00456cc0:
  __stack_chk_fail();
}

Assistant:

void QRhiResourceUpdateBatch::uploadStaticBuffer(QRhiBuffer *buf, const void *data)
{
    if (buf->size() > 0) {
        const int idx = d->activeBufferOpCount++;
        if (idx < d->bufferOps.size())
            QRhiResourceUpdateBatchPrivate::BufferOp::changeToStaticUpload(&d->bufferOps[idx], buf, 0, 0, data);
        else
            d->bufferOps.append(QRhiResourceUpdateBatchPrivate::BufferOp::staticUpload(buf, 0, 0, data));
    }
}